

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

any __thiscall cs_impl::any::make_constant<cs::numeric,cs::numeric_const&>(any *this,numeric *args)

{
  _func_int **pp_Var1;
  baseHolder *pbVar2;
  proxy *ppVar3;
  
  if ((DAT_00336ee0 == 0) || (cs::global_thread_counter != 0)) {
    pbVar2 = (baseHolder *)operator_new(0x30);
  }
  else {
    pbVar2 = *(baseHolder **)(&holder<cs::type_t>::allocator + DAT_00336ee0 * 8);
    DAT_00336ee0 = DAT_00336ee0 + -1;
  }
  pbVar2->_vptr_baseHolder = (_func_int **)&PTR__baseHolder_00325c80;
  pp_Var1 = *(_func_int ***)((long)&args->data + 8);
  pbVar2[2]._vptr_baseHolder = (_func_int **)(args->data)._int;
  pbVar2[3]._vptr_baseHolder = pp_Var1;
  *(bool *)&pbVar2[4]._vptr_baseHolder = args->type;
  if ((DAT_00339e90 == 0) || (cs::global_thread_counter != 0)) {
    ppVar3 = (proxy *)operator_new(0x18);
  }
  else {
    ppVar3 = (proxy *)(&cs::null_pointer)[DAT_00339e90];
    DAT_00339e90 = DAT_00339e90 + -1;
  }
  ppVar3->is_rvalue = false;
  ppVar3->protect_level = 2;
  ppVar3->refcount = 1;
  ppVar3->data = pbVar2;
  this->mDat = ppVar3;
  return (any)(proxy *)this;
}

Assistant:

static any make_constant(ArgsT &&...args)
		{
			return any(allocator.alloc(2, 1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}